

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  undefined8 uVar1;
  ulong nbCols;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar4 = *(ulong *)other;
  nbCols = *(ulong *)(other + 8);
  if ((nbCols != 0 && uVar4 != 0) &&
     (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar2 / SEXT816((long)nbCols),0) < (long)uVar4)) {
    puVar5 = (undefined8 *)
             __cxa_allocate_exception(8,other,SUB168(auVar2 % SEXT816((long)nbCols),0));
    *puVar5 = operator_delete;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)(nbCols | uVar4) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar4,uVar4,nbCols);
  if ((*(long *)(this + 8) == *(long *)other) && (*(long *)(this + 0x10) == *(long *)(other + 8))) {
    lVar6 = *(long *)(this + 0x10) * *(long *)(this + 8);
    uVar4 = lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar6) {
      lVar8 = 0;
      do {
        uVar1 = *(undefined8 *)(other + 0x10);
        puVar5 = (undefined8 *)(*(long *)this + lVar8 * 8);
        *puVar5 = uVar1;
        puVar5[1] = uVar1;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar4);
    }
    auVar3 = _DAT_00111bf0;
    auVar2 = _DAT_00111be0;
    lVar8 = lVar6 % 2;
    if (lVar8 != 0 && (long)uVar4 <= lVar6) {
      uVar1 = *(undefined8 *)(other + 0x10);
      lVar7 = lVar8 + -1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar6 = (lVar6 / 2) * 0x10 + *(long *)this;
      uVar4 = 0;
      auVar9 = auVar9 ^ _DAT_00111bf0;
      do {
        auVar10._8_4_ = (int)uVar4;
        auVar10._0_8_ = uVar4;
        auVar10._12_4_ = (int)(uVar4 >> 0x20);
        auVar10 = (auVar10 | auVar2) ^ auVar3;
        if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                    auVar9._4_4_ < auVar10._4_4_) & 1)) {
          *(undefined8 *)(lVar6 + uVar4 * 8) = uVar1;
        }
        if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
            auVar10._12_4_ <= auVar9._12_4_) {
          *(undefined8 *)(lVar6 + 8 + uVar4 * 8) = uVar1;
        }
        uVar4 = uVar4 + 2;
      } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar4);
    }
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }